

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O0

int ecp_add_mixed(mbedtls_ecp_group *grp,mbedtls_ecp_point *R,mbedtls_ecp_point *P,
                 mbedtls_ecp_point *Q)

{
  int iVar1;
  undefined1 local_e0 [8];
  mbedtls_mpi Z;
  mbedtls_mpi Y;
  mbedtls_mpi X;
  mbedtls_mpi T4;
  mbedtls_mpi T3;
  mbedtls_mpi T2;
  mbedtls_mpi T1;
  int ret;
  mbedtls_ecp_point *Q_local;
  mbedtls_ecp_point *P_local;
  mbedtls_ecp_point *R_local;
  mbedtls_ecp_group *grp_local;
  
  add_count = add_count + 1;
  iVar1 = mbedtls_mpi_cmp_int(&P->Z,0);
  if (iVar1 == 0) {
    grp_local._4_4_ = mbedtls_ecp_copy(R,Q);
  }
  else if (((Q->Z).p == (mbedtls_mpi_uint *)0x0) ||
          (iVar1 = mbedtls_mpi_cmp_int(&Q->Z,0), iVar1 != 0)) {
    if (((Q->Z).p == (mbedtls_mpi_uint *)0x0) || (iVar1 = mbedtls_mpi_cmp_int(&Q->Z,1), iVar1 == 0))
    {
      mbedtls_mpi_init((mbedtls_mpi *)&T2.p);
      mbedtls_mpi_init((mbedtls_mpi *)&T3.p);
      mbedtls_mpi_init((mbedtls_mpi *)&T4.p);
      mbedtls_mpi_init((mbedtls_mpi *)&X.p);
      mbedtls_mpi_init((mbedtls_mpi *)&Y.p);
      mbedtls_mpi_init((mbedtls_mpi *)&Z.p);
      mbedtls_mpi_init((mbedtls_mpi *)local_e0);
      T1.p._4_4_ = mbedtls_mpi_mul_mod(grp,(mbedtls_mpi *)&T2.p,&P->Z,&P->Z);
      if ((((T1.p._4_4_ == 0) &&
           (T1.p._4_4_ = mbedtls_mpi_mul_mod(grp,(mbedtls_mpi *)&T3.p,(mbedtls_mpi *)&T2.p,&P->Z),
           T1.p._4_4_ == 0)) &&
          (T1.p._4_4_ = mbedtls_mpi_mul_mod(grp,(mbedtls_mpi *)&T2.p,(mbedtls_mpi *)&T2.p,&Q->X),
          T1.p._4_4_ == 0)) &&
         (((T1.p._4_4_ = mbedtls_mpi_mul_mod(grp,(mbedtls_mpi *)&T3.p,(mbedtls_mpi *)&T3.p,&Q->Y),
           T1.p._4_4_ == 0 &&
           (T1.p._4_4_ = mbedtls_mpi_sub_mod(grp,(mbedtls_mpi *)&T2.p,(mbedtls_mpi *)&T2.p,&P->X),
           T1.p._4_4_ == 0)) &&
          (T1.p._4_4_ = mbedtls_mpi_sub_mod(grp,(mbedtls_mpi *)&T3.p,(mbedtls_mpi *)&T3.p,&P->Y),
          T1.p._4_4_ == 0)))) {
        iVar1 = mbedtls_mpi_cmp_int((mbedtls_mpi *)&T2.p,0);
        if (iVar1 == 0) {
          iVar1 = mbedtls_mpi_cmp_int((mbedtls_mpi *)&T3.p,0);
          if (iVar1 == 0) {
            T1.p._4_4_ = ecp_double_jac(grp,R,P);
          }
          else {
            T1.p._4_4_ = mbedtls_ecp_set_zero(R);
          }
        }
        else {
          T1.p._4_4_ = mbedtls_mpi_mul_mod(grp,(mbedtls_mpi *)local_e0,&P->Z,(mbedtls_mpi *)&T2.p);
          if ((((T1.p._4_4_ == 0) &&
               (T1.p._4_4_ = mbedtls_mpi_mul_mod(grp,(mbedtls_mpi *)&T4.p,(mbedtls_mpi *)&T2.p,
                                                 (mbedtls_mpi *)&T2.p), T1.p._4_4_ == 0)) &&
              ((((T1.p._4_4_ = mbedtls_mpi_mul_mod(grp,(mbedtls_mpi *)&X.p,(mbedtls_mpi *)&T4.p,
                                                   (mbedtls_mpi *)&T2.p), T1.p._4_4_ == 0 &&
                 (((T1.p._4_4_ = mbedtls_mpi_mul_mod(grp,(mbedtls_mpi *)&T4.p,(mbedtls_mpi *)&T4.p,
                                                     &P->X), T1.p._4_4_ == 0 &&
                   (T1.p._4_4_ = mbedtls_mpi_copy((mbedtls_mpi *)&T2.p,(mbedtls_mpi *)&T4.p),
                   T1.p._4_4_ == 0)) &&
                  (T1.p._4_4_ = mbedtls_mpi_shift_l_mod(grp,(mbedtls_mpi *)&T2.p,1), T1.p._4_4_ == 0
                  )))) && ((T1.p._4_4_ = mbedtls_mpi_mul_mod(grp,(mbedtls_mpi *)&Y.p,
                                                             (mbedtls_mpi *)&T3.p,
                                                             (mbedtls_mpi *)&T3.p), T1.p._4_4_ == 0
                           && (T1.p._4_4_ = mbedtls_mpi_sub_mod(grp,(mbedtls_mpi *)&Y.p,
                                                                (mbedtls_mpi *)&Y.p,
                                                                (mbedtls_mpi *)&T2.p),
                              T1.p._4_4_ == 0)))) &&
               (T1.p._4_4_ = mbedtls_mpi_sub_mod(grp,(mbedtls_mpi *)&Y.p,(mbedtls_mpi *)&Y.p,
                                                 (mbedtls_mpi *)&X.p), T1.p._4_4_ == 0)))) &&
             (((T1.p._4_4_ = mbedtls_mpi_sub_mod(grp,(mbedtls_mpi *)&T4.p,(mbedtls_mpi *)&T4.p,
                                                 (mbedtls_mpi *)&Y.p), T1.p._4_4_ == 0 &&
               (T1.p._4_4_ = mbedtls_mpi_mul_mod(grp,(mbedtls_mpi *)&T4.p,(mbedtls_mpi *)&T4.p,
                                                 (mbedtls_mpi *)&T3.p), T1.p._4_4_ == 0)) &&
              ((T1.p._4_4_ = mbedtls_mpi_mul_mod(grp,(mbedtls_mpi *)&X.p,(mbedtls_mpi *)&X.p,&P->Y),
               T1.p._4_4_ == 0 &&
               (((T1.p._4_4_ = mbedtls_mpi_sub_mod(grp,(mbedtls_mpi *)&Z.p,(mbedtls_mpi *)&T4.p,
                                                   (mbedtls_mpi *)&X.p), T1.p._4_4_ == 0 &&
                 (T1.p._4_4_ = mbedtls_mpi_copy(&R->X,(mbedtls_mpi *)&Y.p), T1.p._4_4_ == 0)) &&
                (T1.p._4_4_ = mbedtls_mpi_copy(&R->Y,(mbedtls_mpi *)&Z.p), T1.p._4_4_ == 0)))))))) {
            T1.p._4_4_ = mbedtls_mpi_copy(&R->Z,(mbedtls_mpi *)local_e0);
          }
        }
      }
      mbedtls_mpi_free((mbedtls_mpi *)&T2.p);
      mbedtls_mpi_free((mbedtls_mpi *)&T3.p);
      mbedtls_mpi_free((mbedtls_mpi *)&T4.p);
      mbedtls_mpi_free((mbedtls_mpi *)&X.p);
      mbedtls_mpi_free((mbedtls_mpi *)&Y.p);
      mbedtls_mpi_free((mbedtls_mpi *)&Z.p);
      mbedtls_mpi_free((mbedtls_mpi *)local_e0);
      grp_local._4_4_ = T1.p._4_4_;
    }
    else {
      grp_local._4_4_ = -0x4f80;
    }
  }
  else {
    grp_local._4_4_ = mbedtls_ecp_copy(R,P);
  }
  return grp_local._4_4_;
}

Assistant:

static int ecp_add_mixed( const mbedtls_ecp_group *grp, mbedtls_ecp_point *R,
                          const mbedtls_ecp_point *P, const mbedtls_ecp_point *Q )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    mbedtls_mpi T1, T2, T3, T4, X, Y, Z;

#if defined(MBEDTLS_SELF_TEST)
    add_count++;
#endif

#if defined(MBEDTLS_ECP_ADD_MIXED_ALT)
    if( mbedtls_internal_ecp_grp_capable( grp ) )
        return( mbedtls_internal_ecp_add_mixed( grp, R, P, Q ) );
#endif /* MBEDTLS_ECP_ADD_MIXED_ALT */

    /*
     * Trivial cases: P == 0 or Q == 0 (case 1)
     */
    if( mbedtls_mpi_cmp_int( &P->Z, 0 ) == 0 )
        return( mbedtls_ecp_copy( R, Q ) );

    if( Q->Z.p != NULL && mbedtls_mpi_cmp_int( &Q->Z, 0 ) == 0 )
        return( mbedtls_ecp_copy( R, P ) );

    /*
     * Make sure Q coordinates are normalized
     */
    if( Q->Z.p != NULL && mbedtls_mpi_cmp_int( &Q->Z, 1 ) != 0 )
        return( MBEDTLS_ERR_ECP_BAD_INPUT_DATA );

    mbedtls_mpi_init( &T1 ); mbedtls_mpi_init( &T2 ); mbedtls_mpi_init( &T3 ); mbedtls_mpi_init( &T4 );
    mbedtls_mpi_init( &X ); mbedtls_mpi_init( &Y ); mbedtls_mpi_init( &Z );

    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mod( grp, &T1,  &P->Z,  &P->Z ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mod( grp, &T2,  &T1,    &P->Z ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mod( grp, &T1,  &T1,    &Q->X ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mod( grp, &T2,  &T2,    &Q->Y ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_sub_mod( grp, &T1,  &T1,    &P->X ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_sub_mod( grp, &T2,  &T2,    &P->Y ) );

    /* Special cases (2) and (3) */
    if( mbedtls_mpi_cmp_int( &T1, 0 ) == 0 )
    {
        if( mbedtls_mpi_cmp_int( &T2, 0 ) == 0 )
        {
            ret = ecp_double_jac( grp, R, P );
            goto cleanup;
        }
        else
        {
            ret = mbedtls_ecp_set_zero( R );
            goto cleanup;
        }
    }

    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mod( grp, &Z,   &P->Z,  &T1   ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mod( grp, &T3,  &T1,    &T1   ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mod( grp, &T4,  &T3,    &T1   ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mod( grp, &T3,  &T3,    &P->X ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_copy( &T1, &T3 ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_shift_l_mod( grp, &T1,  1     ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mod( grp, &X,   &T2,    &T2   ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_sub_mod( grp, &X,   &X,     &T1   ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_sub_mod( grp, &X,   &X,     &T4   ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_sub_mod( grp, &T3,  &T3,    &X    ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mod( grp, &T3,  &T3,    &T2   ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mod( grp, &T4,  &T4,    &P->Y ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_sub_mod( grp, &Y,   &T3,    &T4   ) );

    MBEDTLS_MPI_CHK( mbedtls_mpi_copy( &R->X, &X ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_copy( &R->Y, &Y ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_copy( &R->Z, &Z ) );

cleanup:

    mbedtls_mpi_free( &T1 ); mbedtls_mpi_free( &T2 ); mbedtls_mpi_free( &T3 ); mbedtls_mpi_free( &T4 );
    mbedtls_mpi_free( &X ); mbedtls_mpi_free( &Y ); mbedtls_mpi_free( &Z );

    return( ret );
}